

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binned_histogram.cpp
# Opt level: O2

AggregateFunction * duckdb::HistogramExactFun::GetFunction(void)

{
  AggregateFunction *in_RDI;
  long lVar1;
  initializer_list<duckdb::LogicalType> __l;
  allocator_type local_b2;
  allocator local_b1;
  LogicalType local_b0;
  LogicalType local_98;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_80;
  LogicalType local_68 [2];
  string local_38;
  
  ::std::__cxx11::string::string((string *)&local_38,"histogram_exact",&local_b1);
  LogicalType::LogicalType(local_68,ANY);
  LogicalType::LogicalType(&local_98,ANY);
  LogicalType::LIST(local_68 + 1,&local_98);
  __l._M_len = 2;
  __l._M_array = local_68;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            (&local_80,__l,&local_b2);
  LogicalType::LogicalType(&local_b0,MAP);
  AggregateFunction::AggregateFunction
            (in_RDI,&local_38,(vector<duckdb::LogicalType,_true> *)&local_80,&local_b0,
             (aggregate_size_t)0x0,(aggregate_initialize_t)0x0,(aggregate_update_t)0x0,
             (aggregate_combine_t)0x0,(aggregate_finalize_t)0x0,(aggregate_simple_update_t)0x0,
             HistogramBinBindFunction<duckdb::HistogramExact>,(aggregate_destructor_t)0x0,
             (aggregate_statistics_t)0x0,(aggregate_window_t)0x0,(aggregate_serialize_t)0x0,
             (aggregate_deserialize_t)0x0);
  LogicalType::~LogicalType(&local_b0);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_80);
  lVar1 = 0x18;
  do {
    LogicalType::~LogicalType((LogicalType *)(&local_68[0].id_ + lVar1));
    lVar1 = lVar1 + -0x18;
  } while (lVar1 != -0x18);
  LogicalType::~LogicalType(&local_98);
  ::std::__cxx11::string::~string((string *)&local_38);
  return in_RDI;
}

Assistant:

AggregateFunction HistogramExactFun::GetFunction() {
	return AggregateFunction("histogram_exact", {LogicalType::ANY, LogicalType::LIST(LogicalType::ANY)},
	                         LogicalTypeId::MAP, nullptr, nullptr, nullptr, nullptr, nullptr, nullptr,
	                         HistogramBinBindFunction<HistogramExact>, nullptr);
}